

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O0

int modrm_dec(pt_ild *ild,uint8_t length)

{
  byte bVar1;
  uint8_t *puVar2;
  uint8_t uVar3;
  byte bVar4;
  byte bVar5;
  pti_map_enum_t pVar6;
  pti_modrm local_40;
  uint8_t sib;
  uint8_t rm;
  uint8_t mod;
  uint8_t eamode;
  pti_map_enum_t map;
  pti_modrm has_modrm;
  uint8_t *table;
  pti_modrm_desc *desc;
  uint8_t length_local;
  pt_ild *ild_local;
  
  if (ild == (pt_ild *)0x0) {
    ild_local._4_4_ = -1;
  }
  else {
    pVar6 = pti_get_map(ild);
    if (pVar6 < PTI_MAP_INVALID) {
      puVar2 = has_modrm_table[ild->vex][pVar6].table;
      if (puVar2 == (uint8_t *)0x0) {
        local_40 = has_modrm_table[ild->vex][pVar6].has_modrm;
      }
      else {
        local_40 = (pti_modrm)puVar2[ild->nominal_opcode];
      }
      switch(local_40) {
      case PTI_MODRM_FALSE:
      case PTI_MODRM_UNDEF:
        ild_local._4_4_ = disp_dec(ild,length);
        break;
      case PTI_MODRM_TRUE:
        bVar1 = eamode_table[*(ushort *)&ild->field_0x10 >> 1 & 1][ild->mode];
        if (length < ild->max_bytes) {
          uVar3 = get_byte(ild,length);
          ild->modrm_byte = uVar3;
          bVar4 = pti_get_modrm_mod(ild);
          bVar5 = pti_get_modrm_rm(ild);
          ild->disp_bytes = disp_default[bVar1][bVar4][bVar5];
          if (has_sib[bVar1][bVar4][bVar5] == '\0') {
            ild_local._4_4_ = disp_dec(ild,length + '\x01');
          }
          else {
            ild_local._4_4_ = sib_dec(ild,length + '\x01');
          }
        }
        else {
          ild_local._4_4_ = -0xe;
        }
        break;
      case PTI_MODRM_IGNORE_MOD:
        if (length < ild->max_bytes) {
          uVar3 = get_byte(ild,length);
          ild->modrm_byte = uVar3;
          ild_local._4_4_ = disp_dec(ild,length + '\x01');
        }
        else {
          ild_local._4_4_ = -0xe;
        }
        break;
      default:
        ild_local._4_4_ = -0xe;
      }
    }
    else {
      ild_local._4_4_ = -0xe;
    }
  }
  return ild_local._4_4_;
}

Assistant:

static int modrm_dec(struct pt_ild *ild, uint8_t length)
{
	const struct pti_modrm_desc *desc;
	const uint8_t *table;
	enum pti_modrm has_modrm;
	pti_map_enum_t map;

	if (!ild)
		return -pte_internal;

	map = pti_get_map(ild);
	if (PTI_MAP_INVALID <= map)
		return -pte_bad_insn;

	desc = &has_modrm_table[ild->vex][map];
	table = desc->table;
	has_modrm = table ? table[ild->nominal_opcode] : desc->has_modrm;
	switch (has_modrm) {
	case PTI_MODRM_FALSE:
	case PTI_MODRM_UNDEF:
		return disp_dec(ild, length);

	case PTI_MODRM_IGNORE_MOD:
		if (length >= ild->max_bytes)
			return -pte_bad_insn;

		ild->modrm_byte = get_byte(ild, length);
		return disp_dec(ild, length + 1);

	case PTI_MODRM_TRUE: {
		uint8_t eamode = eamode_table[ild->asz][ild->mode];
		uint8_t mod, rm, sib;

		if (length >= ild->max_bytes)
			return -pte_bad_insn;

		ild->modrm_byte = get_byte(ild, length);
		mod = pti_get_modrm_mod(ild);
		rm = pti_get_modrm_rm(ild);

		ild->disp_bytes = disp_default[eamode][mod][rm];
		sib = has_sib[eamode][mod][rm];
		if (sib)
			return sib_dec(ild, length + 1);
	}
		return disp_dec(ild, length + 1);
	}

	return -pte_bad_insn;
}